

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

Offset<flatbuffers::String> __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::CreateSharedString
          (FlatBufferBuilderImpl<false> *this,char *str,size_t len)

{
  _Rb_tree_header *p_Var1;
  uint8_t **ppuVar2;
  uint uVar3;
  uint uVar4;
  StringOffsetMap *pSVar5;
  iterator iVar6;
  long lVar7;
  _Base_ptr __k;
  Offset<flatbuffers::String> off;
  
  if (this->string_pool == (StringOffsetMap *)0x0) {
    pSVar5 = (StringOffsetMap *)operator_new(0x30);
    (pSVar5->_M_t)._M_impl.
    super__Rb_tree_key_compare<flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare>.
    _M_key_compare.buf_ = &this->buf_;
    (pSVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (pSVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    p_Var1 = &(pSVar5->_M_t)._M_impl.super__Rb_tree_header;
    (pSVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (pSVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (pSVar5->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    this->string_pool = pSVar5;
  }
  uVar3 = (this->buf_).size_;
  CreateString<flatbuffers::Offset>(this,str,len);
  __k = (_Base_ptr)&off;
  iVar6 = std::
          _Rb_tree<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::Offset<flatbuffers::String>,_std::_Identity<flatbuffers::Offset<flatbuffers::String>_>,_flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
          ::find(&this->string_pool->_M_t,(key_type *)__k);
  if (iVar6._M_node ==
      (_Base_ptr)
      ((_Rb_tree<flatbuffers::Offset<flatbuffers::String>,flatbuffers::Offset<flatbuffers::String>,std::_Identity<flatbuffers::Offset<flatbuffers::String>>,flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,std::allocator<flatbuffers::Offset<flatbuffers::String>>>
        *)this->string_pool + 8)) {
    std::
    _Rb_tree<flatbuffers::Offset<flatbuffers::String>,flatbuffers::Offset<flatbuffers::String>,std::_Identity<flatbuffers::Offset<flatbuffers::String>>,flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,std::allocator<flatbuffers::Offset<flatbuffers::String>>>
    ::_M_insert_unique<flatbuffers::Offset<flatbuffers::String>const&>
              ((_Rb_tree<flatbuffers::Offset<flatbuffers::String>,flatbuffers::Offset<flatbuffers::String>,std::_Identity<flatbuffers::Offset<flatbuffers::String>>,flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,std::allocator<flatbuffers::Offset<flatbuffers::String>>>
                *)this->string_pool,(Offset<flatbuffers::String> *)__k);
  }
  else {
    uVar4 = (this->buf_).size_;
    lVar7 = (ulong)uVar4 - (ulong)uVar3;
    ppuVar2 = &(this->buf_).cur_;
    *ppuVar2 = *ppuVar2 + lVar7;
    (this->buf_).size_ = uVar4 - (int)lVar7;
    __k = iVar6._M_node + 1;
  }
  return (Offset<flatbuffers::String>)__k->_M_color;
}

Assistant:

Offset<String> CreateSharedString(const char *str, size_t len) {
    FLATBUFFERS_ASSERT(FLATBUFFERS_GENERAL_HEAP_ALLOC_OK);
    if (!string_pool) {
      string_pool = new StringOffsetMap(StringOffsetCompare(buf_));
    }

    const size_t size_before_string = buf_.size();
    // Must first serialize the string, since the set is all offsets into
    // buffer.
    const Offset<String> off = CreateString<Offset>(str, len);
    auto it = string_pool->find(off);
    // If it exists we reuse existing serialized data!
    if (it != string_pool->end()) {
      // We can remove the string we serialized.
      buf_.pop(buf_.size() - size_before_string);
      return *it;
    }
    // Record this string for future use.
    string_pool->insert(off);
    return off;
  }